

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_color_hsva_f(float *out_h,float *out_s,float *out_v,float *out_a,nk_color in)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar1 = (float)((uint)in & 0xff) * 0.003921569;
  fVar3 = (float)((uint)in >> 8 & 0xff) * 0.003921569;
  fVar4 = (float)((uint)in >> 0x10 & 0xff) * 0.003921569;
  fVar7 = fVar3;
  fVar2 = fVar4;
  if (fVar4 <= fVar3) {
    fVar7 = fVar4;
    fVar2 = fVar3;
  }
  fVar5 = (float)(-(uint)(fVar3 < fVar4) & 0xbf800000);
  fVar4 = fVar2;
  fVar3 = fVar1;
  if (fVar2 <= fVar1) {
    fVar4 = fVar1;
    fVar3 = fVar2;
  }
  fVar6 = fVar3;
  if (fVar7 <= fVar3) {
    fVar6 = fVar7;
  }
  fVar7 = (fVar3 - fVar7) / ((fVar4 - fVar6) * 6.0 + 1e-20) +
          (float)(-(uint)(fVar1 < fVar2) & (uint)(-0.33333334 - fVar5) |
                 ~-(uint)(fVar1 < fVar2) & (uint)fVar5);
  fVar2 = -fVar7;
  if (-fVar7 <= fVar7) {
    fVar2 = fVar7;
  }
  *out_h = fVar2;
  *out_s = (fVar4 - fVar6) / (fVar4 + 1e-20);
  *out_v = fVar4;
  *out_a = (float)((uint)in >> 0x18) / 255.0;
  return;
}

Assistant:

NK_API void
nk_color_hsva_f(float *out_h, float *out_s,
    float *out_v, float *out_a, struct nk_color in)
{
    float chroma;
    float K = 0.0f;
    float r,g,b,a;

    nk_color_f(&r,&g,&b,&a, in);
    if (g < b) {
        const float t = g; g = b; b = t;
        K = -1.f;
    }
    if (r < g) {
        const float t = r; r = g; g = t;
        K = -2.f/6.0f - K;
    }
    chroma = r - ((g < b) ? g: b);
    *out_h = NK_ABS(K + (g - b)/(6.0f * chroma + 1e-20f));
    *out_s = chroma / (r + 1e-20f);
    *out_v = r;
    *out_a = (float)in.a / 255.0f;
}